

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapParse.c
# Opt level: O0

int Amap_LibParseEquations(Amap_Lib_t *p,int fVerbose)

{
  Aig_MmFlex_t *p_00;
  void *__dest;
  int iVar1;
  Vec_Int_t *vTruth_00;
  Vec_Ptr_t *p_01;
  Hop_Man_t *p_02;
  void *pvVar2;
  char *pcVar3;
  Hop_Obj_t *pRoot;
  uint *pTruth_00;
  int local_54;
  int nPinMax;
  int i;
  uint *pTruth;
  Amap_Pin_t *pPin;
  Amap_Gat_t *pGate;
  Vec_Int_t *vTruth;
  Vec_Ptr_t *vNames;
  Hop_Obj_t *pObj;
  Hop_Man_t *pMan;
  int fVerbose_local;
  Amap_Lib_t *p_local;
  
  iVar1 = Amap_LibNumPinsMax(p);
  if (0xf < iVar1) {
    printf("Gates with more than %d inputs will be ignored.\n",0xf);
  }
  vTruth_00 = Vec_IntAlloc(0x10000);
  p_01 = Vec_PtrAlloc(100);
  p_02 = Hop_ManStart();
  Hop_IthVar(p_02,iVar1 + -1);
  local_54 = 0;
  do {
    iVar1 = Vec_PtrSize(p->vGates);
    if (iVar1 <= local_54) {
LAB_0051eb7e:
      Vec_PtrFree(p_01);
      Vec_IntFree(vTruth_00);
      Hop_ManStop(p_02);
      iVar1 = Vec_PtrSize(p->vGates);
      return (int)(local_54 == iVar1);
    }
    pvVar2 = Vec_PtrEntry(p->vGates,local_54);
    if (*(uint *)((long)pvVar2 + 0x38) >> 0x18 == 0) {
      pcVar3 = Aig_MmFlexEntryFetch(p->pMemGates,4);
      *(char **)((long)pvVar2 + 0x30) = pcVar3;
      iVar1 = strcmp(*(char **)((long)pvVar2 + 0x28),"CONST0");
      if (iVar1 == 0) {
        **(undefined4 **)((long)pvVar2 + 0x30) = 0;
      }
      else {
        iVar1 = strcmp(*(char **)((long)pvVar2 + 0x28),"CONST1");
        if (iVar1 != 0) {
          printf("Cannot parse formula \"%s\" of gate \"%s\" with no pins.\n",
                 *(undefined8 *)((long)pvVar2 + 0x28),*(undefined8 *)((long)pvVar2 + 0x10));
          goto LAB_0051eb7e;
        }
        **(undefined4 **)((long)pvVar2 + 0x30) = 0xffffffff;
      }
    }
    else if (*(uint *)((long)pvVar2 + 0x38) >> 0x18 < 0x10) {
      Vec_PtrClear(p_01);
      for (pTruth = (uint *)((long)pvVar2 + 0x40);
          pTruth < (uint *)((long)pvVar2 +
                           (long)(int)(*(uint *)((long)pvVar2 + 0x38) >> 0x18) * 0x48 + 0x40);
          pTruth = pTruth + 0x12) {
        Vec_PtrPush(p_01,*(void **)pTruth);
      }
      pRoot = Amap_ParseFormula(_stdout,*(char **)((long)pvVar2 + 0x28),p_01,p_02,
                                *(char **)((long)pvVar2 + 0x10));
      if (pRoot == (Hop_Obj_t *)0x0) goto LAB_0051eb7e;
      pTruth_00 = Hop_ManConvertAigToTruth
                            (p_02,pRoot,*(uint *)((long)pvVar2 + 0x38) >> 0x18,vTruth_00,0);
      iVar1 = Kit_TruthSupportSize(pTruth_00,*(uint *)((long)pvVar2 + 0x38) >> 0x18);
      if (iVar1 < (int)(*(uint *)((long)pvVar2 + 0x38) >> 0x18)) {
        if (fVerbose != 0) {
          printf("Skipping gate \"%s\" because its output \"%s\" does not depend on all input variables.\n"
                 ,*(undefined8 *)((long)pvVar2 + 0x10),*(undefined8 *)((long)pvVar2 + 0x28));
        }
      }
      else {
        p_00 = p->pMemGates;
        iVar1 = Abc_TruthWordNum(*(uint *)((long)pvVar2 + 0x38) >> 0x18);
        pcVar3 = Aig_MmFlexEntryFetch(p_00,iVar1 << 2);
        *(char **)((long)pvVar2 + 0x30) = pcVar3;
        __dest = *(void **)((long)pvVar2 + 0x30);
        iVar1 = Abc_TruthWordNum(*(uint *)((long)pvVar2 + 0x38) >> 0x18);
        memcpy(__dest,pTruth_00,(long)iVar1 << 2);
      }
    }
    local_54 = local_54 + 1;
  } while( true );
}

Assistant:

int Amap_LibParseEquations( Amap_Lib_t * p, int fVerbose )
{
//    extern int Kit_TruthSupportSize( unsigned * pTruth, int nVars );
    Hop_Man_t * pMan;
    Hop_Obj_t * pObj;
    Vec_Ptr_t * vNames;
    Vec_Int_t * vTruth;
    Amap_Gat_t * pGate;
    Amap_Pin_t * pPin;
    unsigned * pTruth;
    int i, nPinMax;
    nPinMax = Amap_LibNumPinsMax(p);
    if ( nPinMax > AMAP_MAXINS )
        printf( "Gates with more than %d inputs will be ignored.\n", AMAP_MAXINS );
    vTruth = Vec_IntAlloc( 1 << 16 );
    vNames = Vec_PtrAlloc( 100 );
    pMan = Hop_ManStart();
    Hop_IthVar( pMan, nPinMax - 1 );
    Vec_PtrForEachEntry( Amap_Gat_t *, p->vGates, pGate, i )
    {
        if ( pGate->nPins == 0 )
        {
            pGate->pFunc = (unsigned *)Aig_MmFlexEntryFetch( p->pMemGates, 4 );
            if ( strcmp( pGate->pForm, AMAP_STRING_CONST0 ) == 0 )
                pGate->pFunc[0] = 0;
            else if ( strcmp( pGate->pForm, AMAP_STRING_CONST1 ) == 0 )
                pGate->pFunc[0] = ~0;
            else
            {
                printf( "Cannot parse formula \"%s\" of gate \"%s\" with no pins.\n", pGate->pForm, pGate->pName );
                break;
            }
            continue;
        }
        if ( pGate->nPins > AMAP_MAXINS )
            continue;
        Vec_PtrClear( vNames );
        Amap_GateForEachPin( pGate, pPin )
            Vec_PtrPush( vNames, pPin->pName );
        pObj = Amap_ParseFormula( stdout, pGate->pForm, vNames, pMan, pGate->pName );
        if ( pObj == NULL )
            break;
        pTruth = Hop_ManConvertAigToTruth( pMan, pObj, pGate->nPins, vTruth, 0 );
        if ( Kit_TruthSupportSize(pTruth, pGate->nPins) < (int)pGate->nPins )
        {
            if ( fVerbose )
                printf( "Skipping gate \"%s\" because its output \"%s\" does not depend on all input variables.\n", pGate->pName, pGate->pForm );
            continue;
        }
        pGate->pFunc = (unsigned *)Aig_MmFlexEntryFetch( p->pMemGates, sizeof(unsigned)*Abc_TruthWordNum(pGate->nPins) );
        memcpy( pGate->pFunc, pTruth, sizeof(unsigned)*Abc_TruthWordNum(pGate->nPins) );
    }
    Vec_PtrFree( vNames );
    Vec_IntFree( vTruth );
    Hop_ManStop( pMan );
    return i == Vec_PtrSize(p->vGates);
}